

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall
CircularArrayTest_const_back_Test::CircularArrayTest_const_back_Test
          (CircularArrayTest_const_back_Test *this)

{
  CircularArrayTest_const_back_Test *this_local;
  
  anon_unknown.dwarf_f66d::CircularArrayTest::CircularArrayTest(&this->super_CircularArrayTest);
  (this->super_CircularArrayTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CircularArrayTest_const_back_Test_005c20f8;
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_back) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ASSERT_EQ(1, cca.back().data);

  ca.push_back(TestObject(2));
  ASSERT_EQ(2, cca.back().data);
}